

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::~ShardedLRUCache(ShardedLRUCache *this)

{
  LRUHandle *pLVar1;
  void *pvVar2;
  LRUHandle *e;
  long lVar3;
  
  (this->super_Cache)._vptr_Cache = (_func_int **)&PTR__ShardedLRUCache_00174b50;
  lVar3 = 0xd90;
  do {
    if (*(long *)((long)this->shard_ + lVar3 + -0x50) != (long)this->shard_ + lVar3 + -0x68) {
      __assert_fail("in_use_.next == &in_use_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,0xcf,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
    }
    e = *(LRUHandle **)((long)this + lVar3 + -0x88);
    while (e != (LRUHandle *)((long)this + lVar3 + -0xa0)) {
      if (e->in_cache == false) {
        __assert_fail("e->in_cache",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0xd2,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
      }
      pLVar1 = e->next;
      e->in_cache = false;
      if (e->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0xd4,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
      }
      LRUCache::Unref((LRUCache *)((long)this + lVar3 + -0xd8),e);
      e = pLVar1;
    }
    pvVar2 = *(void **)((long)this->shard_ + lVar3 + -0x18);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    lVar3 = lVar3 + -0xd8;
    if (lVar3 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

~ShardedLRUCache() override {}